

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86_fma.cpp
# Opt level: O1

void ncnn::compute_B_int8_scale(Mat *B,float *scale)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  uint uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  undefined1 (*pauVar9) [32];
  int iVar10;
  uint uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [64];
  undefined1 auVar19 [16];
  undefined1 auVar20 [32];
  undefined1 auVar21 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [32];
  undefined1 auVar26 [16];
  undefined1 auVar27 [32];
  undefined1 auVar28 [16];
  undefined1 auVar29 [64];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [32];
  
  if ((long)(&B->h)[(ulong)(B->dims == 3) * 2] < 1) {
    auVar20 = ZEXT832(0);
    auVar16 = ZEXT816(0);
    auVar12 = ZEXT816(0);
  }
  else {
    iVar4 = B->w;
    if (B->dims == 3) {
      iVar4 = (int)B->cstep;
    }
    uVar3 = B->w * B->elempack;
    auVar29 = ZEXT864(0);
    auVar18 = ZEXT864(0);
    auVar21 = ZEXT864(0);
    lVar8 = 0;
    auVar27._8_4_ = 0x7fffffff;
    auVar27._0_8_ = 0x7fffffff7fffffff;
    auVar27._12_4_ = 0x7fffffff;
    auVar27._16_4_ = 0x7fffffff;
    auVar27._20_4_ = 0x7fffffff;
    auVar27._24_4_ = 0x7fffffff;
    auVar27._28_4_ = 0x7fffffff;
    auVar22 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
    auVar26._8_8_ = 0x8000000000000000;
    auVar26._0_8_ = 0x8000000000000000;
    auVar17 = vpcmpeqd_avx(in_ZMM3._0_16_,in_ZMM3._0_16_);
    do {
      pauVar9 = (undefined1 (*) [32])((long)B->data + (long)(iVar4 * B->elempack * (int)lVar8) * 4);
      if ((int)uVar3 < 8) {
        uVar5 = 0;
      }
      else {
        iVar10 = 7;
        do {
          auVar20 = vandps_avx(auVar27,*pauVar9);
          auVar20 = vmaxps_avx(auVar21._0_32_,auVar20);
          auVar21 = ZEXT3264(auVar20);
          pauVar9 = pauVar9 + 1;
          iVar10 = iVar10 + 8;
          uVar5 = uVar3 & 0xfffffff8;
        } while (iVar10 < (int)uVar3);
      }
      auVar20 = auVar21._0_32_;
      uVar11 = uVar5 | 3;
      while (auVar16 = auVar18._0_16_, (int)uVar11 < (int)uVar3) {
        auVar12 = vandps_avx(auVar22._0_16_,*(undefined1 (*) [16])*pauVar9);
        auVar16 = vmaxps_avx(auVar16,auVar12);
        auVar18 = ZEXT1664(auVar16);
        pauVar9 = (undefined1 (*) [32])(*pauVar9 + 0x10);
        uVar11 = uVar5 + 7;
        uVar5 = uVar5 + 4;
      }
      if ((int)uVar5 < (int)uVar3) {
        uVar6 = CONCAT44(0,~uVar5 + uVar3);
        auVar12 = vshufps_avx(auVar29._0_16_,auVar29._0_16_,0);
        auVar32._16_16_ = auVar12;
        auVar32._0_16_ = auVar12;
        auVar12._8_8_ = 0;
        auVar12._0_8_ = uVar6;
        auVar28 = vpshufd_avx(auVar12,0x44);
        auVar12 = vorps_avx(auVar28,auVar26);
        auVar30 = vorps_avx(auVar28,auVar26);
        uVar7 = 0;
        do {
          auVar2 = auVar32;
          auVar13._8_8_ = 0;
          auVar13._0_8_ = uVar7;
          auVar13 = vpshufd_avx(auVar13,0x44);
          auVar15._16_16_ = auVar13;
          auVar15._0_16_ = auVar13;
          auVar1 = vorps_avx(auVar15,_DAT_005f0880);
          auVar15 = vorps_avx(auVar15,_DAT_005f08a0);
          auVar13 = vorps_avx(auVar28,auVar26);
          auVar14._0_8_ = auVar15._16_8_ ^ 0x8000000000000000;
          auVar14._8_4_ = auVar15._24_4_;
          auVar14._12_4_ = auVar15._28_4_ ^ 0x80000000;
          auVar19 = vpcmpgtq_avx(auVar14,auVar13);
          auVar31._0_8_ = auVar15._0_8_ ^ 0x8000000000000000;
          auVar31._8_4_ = auVar15._8_4_;
          auVar31._12_4_ = auVar15._12_4_ ^ 0x80000000;
          auVar14 = vpcmpgtq_avx(auVar31,auVar12);
          auVar14 = vpackssdw_avx(auVar14,auVar19);
          auVar23._0_8_ = auVar1._16_8_ ^ 0x8000000000000000;
          auVar23._8_4_ = auVar1._24_4_;
          auVar23._12_4_ = auVar1._28_4_ ^ 0x80000000;
          auVar23 = vpcmpgtq_avx(auVar23,auVar13);
          auVar24._0_8_ = auVar1._0_8_ ^ 0x8000000000000000;
          auVar24._8_4_ = auVar1._8_4_;
          auVar24._12_4_ = auVar1._12_4_ ^ 0x80000000;
          auVar13 = vpcmpgtq_avx(auVar24,auVar30);
          auVar13 = vpackssdw_avx(auVar13,auVar23);
          auVar13 = vpackssdw_avx(auVar13 ^ auVar17,auVar14 ^ auVar17);
          auVar14 = vpmovsxwd_avx(auVar13);
          auVar13 = vpunpckhwd_avx(auVar13,auVar13);
          auVar25._16_16_ = auVar13;
          auVar25._0_16_ = auVar14;
          auVar32 = vmaskmovps_avx(auVar25,*(undefined1 (*) [32])(*pauVar9 + uVar7 * 4));
          auVar32 = vandps_avx(auVar27,auVar32);
          auVar32 = vmaxps_avx(auVar2,auVar32);
          uVar7 = uVar7 + 8;
        } while ((uVar6 + 8 & 0xfffffffffffffff8) != uVar7);
        auVar12 = vorps_avx(auVar28,auVar26);
        auVar30._0_8_ = auVar15._0_8_ ^ 0x8000000000000000;
        auVar30._8_4_ = auVar15._8_4_;
        auVar30._12_4_ = auVar15._12_4_ ^ 0x80000000;
        auVar12 = vpcmpgtq_avx(auVar30,auVar12);
        auVar30 = vpackssdw_avx(auVar12,auVar19);
        auVar12 = vorps_avx(auVar28,auVar26);
        auVar28._8_4_ = auVar1._8_4_;
        auVar28._0_8_ = auVar1._0_8_ ^ 0x8000000000000000;
        auVar28._12_4_ = auVar1._12_4_ ^ 0x80000000;
        auVar12 = vpcmpgtq_avx(auVar28,auVar12);
        auVar12 = vpackssdw_avx(auVar12,auVar23);
        auVar12 = vblendvps_avx(auVar2._0_16_,auVar32._0_16_,auVar12 ^ auVar17);
        auVar30 = vblendvps_avx(auVar2._16_16_,auVar32._16_16_,auVar30 ^ auVar17);
        auVar12 = vmaxps_avx(auVar12,auVar30);
        auVar30 = vshufpd_avx(auVar12,auVar12,1);
        auVar12 = vmaxps_avx(auVar12,auVar30);
        auVar30 = vmovshdup_avx(auVar12);
        auVar12 = vmaxss_avx(auVar12,auVar30);
        auVar29 = ZEXT1664(auVar12);
        auVar22 = ZEXT1664(CONCAT412(0x7fffffff,CONCAT48(0x7fffffff,0x7fffffff7fffffff)));
      }
      auVar12 = auVar29._0_16_;
      lVar8 = lVar8 + 1;
    } while (lVar8 != (&B->h)[(ulong)(B->dims == 3) * 2]);
  }
  auVar17 = vmaxps_avx(auVar20._16_16_,auVar20._0_16_);
  auVar26 = vshufpd_avx(auVar17,auVar17,3);
  auVar17 = vmaxps_avx(auVar17,auVar26);
  auVar26 = vmovshdup_avx(auVar17);
  auVar17 = vmaxss_avx(auVar17,auVar26);
  auVar26 = vshufpd_avx(auVar16,auVar16,3);
  auVar16 = vmaxps_avx(auVar16,auVar26);
  auVar26 = vmovshdup_avx(auVar16);
  auVar16 = vmaxss_avx(auVar16,auVar26);
  auVar16 = vmaxss_avx(auVar12,auVar16);
  auVar16 = vmaxss_avx(auVar16,auVar17);
  auVar17._0_4_ = 127.0 / auVar16._0_4_;
  auVar17._4_12_ = SUB6012((undefined1  [60])0x0,0);
  auVar16 = vcmpss_avx(auVar16,ZEXT416(0),0);
  auVar19._8_4_ = 0x3f800000;
  auVar19._0_8_ = 0x3f8000003f800000;
  auVar19._12_4_ = 0x3f800000;
  auVar16 = vblendvps_avx(auVar17,auVar19,auVar16);
  *scale = auVar16._0_4_;
  return;
}

Assistant:

static void compute_B_int8_scale(const Mat& B, float& scale)
{
    compute_B_fp32_int8_scale(B, scale);
}